

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefaultFunctionPortSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::DefaultFunctionPortSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  DefaultFunctionPortSyntax *pDVar6;
  
  pDVar6 = (DefaultFunctionPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultFunctionPortSyntax *)this->endPtr < pDVar6 + 1) {
    pDVar6 = (DefaultFunctionPortSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pDVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pDVar6->super_FunctionPortBaseSyntax).super_SyntaxNode.kind = DefaultFunctionPort;
  (pDVar6->super_FunctionPortBaseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar6->super_FunctionPortBaseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar6->keyword).kind = TVar2;
  (pDVar6->keyword).field_0x2 = uVar3;
  (pDVar6->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pDVar6->keyword).rawLen = uVar5;
  (pDVar6->keyword).info = pIVar1;
  return pDVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }